

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUSSEImpl.hpp
# Opt level: O0

BeagleImpl * __thiscall
beagle::cpu::BeagleCPUSSEImplFactory<double>::createImpl
          (BeagleCPUSSEImplFactory<double> *this,int tipCount,int partialsBufferCount,
          int compactBufferCount,int stateCount,int patternCount,int eigenBufferCount,
          int matrixBufferCount,int categoryCount,int scaleBufferCount,int resourceNumber,
          int pluginResourceNumber,long preferenceFlags,long requirementFlags,int *errorCode)

{
  undefined1 auVar1 [64];
  int iVar2;
  BeagleImpl *pBVar3;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  uint in_R8D;
  uint in_R9D;
  undefined1 auVar4 [64];
  BeagleCPUSSEImpl<double,_2,_0> *impl_1;
  BeagleCPUSSEImpl<double,_1,_1> *impl;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  
  iVar2 = CPUSupportsSSE();
  if (iVar2 != 0) {
    if ((in_R8D & 1) == 0) {
      pBVar3 = (BeagleImpl *)operator_new(0x178);
      auVar4 = ZEXT1664((undefined1  [16])0x0);
      auVar1 = vmovdqu64_avx512f(auVar4);
      *(undefined1 (*) [64])&pBVar3[0x13].resourceNumber = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar4);
      *(undefined1 (*) [64])(pBVar3 + 0x10) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar4);
      *(undefined1 (*) [64])(pBVar3 + 0xc) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar4);
      *(undefined1 (*) [64])(pBVar3 + 8) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar4);
      *(undefined1 (*) [64])(pBVar3 + 4) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar4);
      *(undefined1 (*) [64])pBVar3 = auVar1;
      BeagleCPUSSEImpl<double,_2,_0>::BeagleCPUSSEImpl
                ((BeagleCPUSSEImpl<double,_2,_0> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      iVar2 = (*pBVar3->_vptr_BeagleImpl[2])
                        (pBVar3,(ulong)in_ESI,(ulong)in_EDX,(ulong)in_ECX,(ulong)in_R8D,
                         (ulong)in_R9D);
      if (iVar2 == 0) {
        return pBVar3;
      }
      if (pBVar3 != (BeagleImpl *)0x0) {
        (*pBVar3->_vptr_BeagleImpl[1])();
      }
    }
    else {
      pBVar3 = (BeagleImpl *)operator_new(0x178);
      auVar4 = ZEXT1664((undefined1  [16])0x0);
      auVar1 = vmovdqu64_avx512f(auVar4);
      *(undefined1 (*) [64])&pBVar3[0x13].resourceNumber = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar4);
      *(undefined1 (*) [64])(pBVar3 + 0x10) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar4);
      *(undefined1 (*) [64])(pBVar3 + 0xc) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar4);
      *(undefined1 (*) [64])(pBVar3 + 8) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar4);
      *(undefined1 (*) [64])(pBVar3 + 4) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar4);
      *(undefined1 (*) [64])pBVar3 = auVar1;
      BeagleCPUSSEImpl<double,_1,_1>::BeagleCPUSSEImpl
                ((BeagleCPUSSEImpl<double,_1,_1> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      iVar2 = (*pBVar3->_vptr_BeagleImpl[2])
                        (pBVar3,(ulong)in_ESI,(ulong)in_EDX,(ulong)in_ECX,(ulong)in_R8D,
                         (ulong)in_R9D);
      if (iVar2 == 0) {
        return pBVar3;
      }
      if (pBVar3 != (BeagleImpl *)0x0) {
        (*pBVar3->_vptr_BeagleImpl[1])();
      }
    }
  }
  return (BeagleImpl *)0x0;
}

Assistant:

BEAGLE_CPU_FACTORY_TEMPLATE
BeagleImpl* BeagleCPUSSEImplFactory<BEAGLE_CPU_FACTORY_GENERIC>::createImpl(int tipCount,
                                             int partialsBufferCount,
                                             int compactBufferCount,
                                             int stateCount,
                                             int patternCount,
                                             int eigenBufferCount,
                                             int matrixBufferCount,
                                             int categoryCount,
                                             int scaleBufferCount,
                                             int resourceNumber,
                                             int pluginResourceNumber,
                                             long preferenceFlags,
                                             long requirementFlags,
                                             int* errorCode) {

    if (!CPUSupportsSSE())
        return NULL;

	if (stateCount & 1) { // is odd
        BeagleCPUSSEImpl<REALTYPE, T_PAD_SSE_ODD, P_PAD_SSE_ODD>* impl =
        new BeagleCPUSSEImpl<REALTYPE, T_PAD_SSE_ODD, P_PAD_SSE_ODD>();


        try {
            if (impl->createInstance(tipCount, partialsBufferCount, compactBufferCount, stateCount,
                                     patternCount, eigenBufferCount, matrixBufferCount,
                                     categoryCount,scaleBufferCount, resourceNumber,
                                     pluginResourceNumber,
                                     preferenceFlags, requirementFlags) == 0)
                return impl;
        }
        catch(...) {
            if (DEBUGGING_OUTPUT)
                std::cerr << "exception in initialize\n";
            delete impl;
            throw;
        }

        delete impl;
	} else {
        BeagleCPUSSEImpl<REALTYPE, T_PAD_SSE_EVEN, P_PAD_SSE_EVEN>* impl =
                new BeagleCPUSSEImpl<REALTYPE, T_PAD_SSE_EVEN, P_PAD_SSE_EVEN>();


        try {
            if (impl->createInstance(tipCount, partialsBufferCount, compactBufferCount, stateCount,
                                     patternCount, eigenBufferCount, matrixBufferCount,
                                     categoryCount,scaleBufferCount, resourceNumber,
                                     pluginResourceNumber,
                                     preferenceFlags, requirementFlags) == 0)
                return impl;
        }
        catch(...) {
            if (DEBUGGING_OUTPUT)
                std::cerr << "exception in initialize\n";
            delete impl;
            throw;
        }

        delete impl;
    }

    return NULL;
}